

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int serial_compare_by_fd(void *av,void *bv)

{
  Serial *b;
  Serial *a;
  void *bv_local;
  void *av_local;
  
  if (*(int *)((long)av + 0x10) < *(int *)((long)bv + 0x10)) {
    av_local._4_4_ = -1;
  }
  else if (*(int *)((long)bv + 0x10) < *(int *)((long)av + 0x10)) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int serial_compare_by_fd(void *av, void *bv)
{
    Serial *a = (Serial *)av;
    Serial *b = (Serial *)bv;

    if (a->fd < b->fd)
        return -1;
    else if (a->fd > b->fd)
        return +1;
    return 0;
}